

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall ptc::Print<char16_t>::Print(Print<char16_t> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  paVar1 = &local_38.field_2;
  local_38.field_2._M_allocated_capacity._0_2_ = 10;
  local_38._M_string_length = 1;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown_8::StringConverter<char16_t>(&this->end,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT62(local_38.field_2._M_allocated_capacity._2_6_,
                             local_38.field_2._M_allocated_capacity._0_2_) + 1);
  }
  local_38.field_2._M_allocated_capacity._0_2_ = 0x20;
  local_38._M_string_length = 1;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown_8::StringConverter<char16_t>(&this->sep,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT62(local_38.field_2._M_allocated_capacity._2_6_,
                             local_38.field_2._M_allocated_capacity._0_2_) + 1);
  }
  (this->pattern)._M_dataplus._M_p = (pointer)&(this->pattern).field_2;
  (this->pattern)._M_string_length = 0;
  (this->pattern).field_2._M_local_buf[0] = L'\0';
  this->flush = false;
  return;
}

Assistant:

explicit Print(): 
     end( StringConverter<T_str>( "\n"s ) ),
     sep( StringConverter<T_str>( " "s ) ),
     flush( false )
     {       
      #ifdef PTC_ENABLE_PERFORMANCE_IMPROVEMENTS
      performance_options();
      #endif
     }